

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpi.cpp
# Opt level: O1

int __thiscall pg::FPISolver::updateBlock(FPISolver *this,int i,int n)

{
  uint uVar1;
  uint64_t *puVar2;
  uint64_t *puVar3;
  ulong uVar4;
  Game *pGVar5;
  int *piVar6;
  int *piVar7;
  uint64_t *puVar8;
  int iVar9;
  ostream *poVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int to;
  ulong uVar14;
  uint *puVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  uint local_54;
  _label_vertex local_40;
  
  if (n == 0) {
    return 0;
  }
  uVar19 = (ulong)i;
  iVar9 = 0;
  do {
    puVar2 = ((this->super_Solver).disabled)->_bits;
    uVar13 = uVar19 >> 6;
    if (((puVar2[uVar13] >> (uVar19 & 0x3f) & 1) == 0) && (this->frozen[uVar19] == 0)) {
      uVar11 = 1L << (uVar19 & 0x3f);
      puVar3 = (this->distraction)._bits;
      uVar4 = puVar3[uVar13];
      if ((uVar4 & uVar11) == 0) {
        pGVar5 = (this->super_Solver).game;
        piVar6 = pGVar5->_outedges;
        lVar16 = (long)pGVar5->_firstouts[uVar19];
        uVar1 = piVar6[lVar16];
        uVar14 = (ulong)uVar1;
        if (((pGVar5->_owner)._bits[uVar13] & uVar11) == 0) {
          if (uVar1 == 0xffffffff) {
            local_54 = 1;
          }
          else {
            piVar7 = this->strategy;
            puVar8 = (this->parity)._bits;
            puVar15 = (uint *)(piVar6 + lVar16 + 1);
            local_54 = 1;
            do {
              uVar12 = (ulong)(long)(int)uVar14 >> 6;
              iVar18 = 7;
              if (((puVar2[uVar12] >> (uVar14 & 0x3f) & 1) == 0) &&
                 (uVar17 = 1L << (uVar14 & 0x3f), iVar18 = 0,
                 ((puVar3[uVar12] & uVar17) != 0) == ((puVar8[uVar12] & uVar17) != 0))) {
                piVar7[uVar19] = (int)uVar14;
                local_54 = 0;
                iVar18 = 5;
              }
              if ((iVar18 != 7) && (iVar18 != 0)) break;
              uVar1 = *puVar15;
              uVar14 = (ulong)uVar1;
              puVar15 = puVar15 + 1;
            } while (uVar1 != 0xffffffff);
          }
        }
        else if (uVar1 == 0xffffffff) {
          local_54 = 0;
        }
        else {
          piVar7 = this->strategy;
          puVar8 = (this->parity)._bits;
          puVar15 = (uint *)(piVar6 + lVar16 + 1);
          local_54 = 0;
          do {
            uVar12 = (ulong)(long)(int)uVar14 >> 6;
            iVar18 = 10;
            if (((puVar2[uVar12] >> (uVar14 & 0x3f) & 1) == 0) &&
               (uVar17 = 1L << (uVar14 & 0x3f), iVar18 = 0,
               ((puVar8[uVar12] & uVar17) != 0) != ((puVar3[uVar12] & uVar17) != 0))) {
              piVar7[uVar19] = (int)uVar14;
              local_54 = 1;
              iVar18 = 8;
            }
            if ((iVar18 != 10) && (iVar18 != 0)) break;
            uVar1 = *puVar15;
            uVar14 = (ulong)uVar1;
            puVar15 = puVar15 + 1;
          } while (uVar1 != 0xffffffff);
        }
        if (local_54 != (((this->parity)._bits[uVar13] & uVar11) != 0)) {
          puVar3[uVar13] = uVar4 | uVar11;
          iVar9 = iVar9 + 1;
          if (1 < (this->super_Solver).trace) {
            poVar10 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"vertex ",7);
            local_40.g = (this->super_Solver).game;
            local_40.v = (int)uVar19;
            poVar10 = operator<<(poVar10,&local_40);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10," is now a distraction (won by ",0x1e);
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_54);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
            std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
          }
        }
      }
    }
    uVar19 = uVar19 + 1;
    n = n + -1;
    if (n == 0) {
      return iVar9;
    }
  } while( true );
}

Assistant:

int
FPISolver::updateBlock(int i, int n)
{
    int res = 0;
    for (; n != 0; i++, n--) {
        if (disabled[i]) continue;
        if (frozen[i]) continue;
        if (distraction[i]) continue;

        // update whether current vertex <i> is a distraction by computing the one step winner
        int onestep_winner;
        if (owner(i) == 0) {
            // see if player Even can go to a vertex currently good for Even
            onestep_winner = 1;
            for (auto curedge = outs(i); *curedge != -1; curedge++) {
                int to = *curedge;
                if (disabled[to]) continue;
                const int winner_to = parity[to] ^ distraction[to];
                if (winner_to == 0) {
                    // good for player Even
                    onestep_winner = 0;
                    // and set the strategy
                    strategy[i] = to;
                    break;
                }
            }
        } else {
            // see if player Odd can go to a vertex currently good for Odd
            onestep_winner = 0;
            for (auto curedge = outs(i); *curedge != -1; curedge++) {
                int to = *curedge;
                if (disabled[to]) continue;
                const int winner_to = parity[to] ^ distraction[to];
                if (winner_to == 1) {
                    // good for player Odd
                    onestep_winner = 1;
                    // and set the strategy
                    strategy[i] = to;
                    break;
                }
            }
        }
        if (parity[i] != onestep_winner) {
            distraction[i] = true;
            res++;
#ifndef NDEBUG
            if (trace >= 2) logger << "vertex " << label_vertex(i) << " is now a distraction (won by " << onestep_winner << ")" << std::endl;
#endif
        }
    }
    return res;
}